

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::Message(Parser *this,string *msg)

{
  ulong uVar1;
  long lVar2;
  int64_t t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_3a;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *msg_local;
  Parser *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->error_,"\n");
  }
  lVar2 = std::__cxx11::string::length();
  local_3a = 0;
  if (lVar2 == 0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  }
  else {
    AbsolutePath(&local_38,&this->file_being_parsed_);
  }
  std::__cxx11::string::operator+=((string *)&this->error_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::operator+=((string *)&this->error_,":");
  }
  NumToString<int>(&local_b0,(this->super_ParserState).line_);
  std::operator+(&local_90,&local_b0,": ");
  t = ParserState::CursorPosition(&this->super_ParserState);
  NumToString<long>(&local_d0,t);
  std::operator+(&local_70,&local_90,&local_d0);
  std::__cxx11::string::operator+=((string *)&this->error_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_f0,": ",local_18);
  std::__cxx11::string::operator+=((string *)&this->error_,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void Parser::Message(const std::string &msg) {
  if (!error_.empty()) error_ += "\n";  // log all warnings and errors
  error_ += file_being_parsed_.length() ? AbsolutePath(file_being_parsed_) : "";
  // clang-format off

  #ifdef _WIN32  // MSVC alike
    error_ +=
        "(" + NumToString(line_) + ", " + NumToString(CursorPosition()) + ")";
  #else  // gcc alike
    if (file_being_parsed_.length()) error_ += ":";
    error_ += NumToString(line_) + ": " + NumToString(CursorPosition());
  #endif
  // clang-format on
  error_ += ": " + msg;
}